

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *this,unsigned_long *Key)

{
  bool bVar1;
  DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_28;
  DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *TheBucket;
  unsigned_long *Key_local;
  DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_local;
  
  TheBucket = (DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)Key;
  Key_local = (unsigned_long *)this;
  bVar1 = LookupBucketFor<unsigned_long>
                    (this,Key,(DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               **)&local_28);
  if (bVar1) {
    this_local = local_28;
  }
  else {
    this_local = (DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)DenseMapBase<llvm::DenseMap<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ::InsertIntoBucket<unsigned_long_const&>
                              ((DenseMapBase<llvm::DenseMap<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                *)this,(DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)local_28,(unsigned_long *)TheBucket);
  }
  return (value_type *)this_local;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }